

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

double * __thiscall ON_PlaneEquation::operator[](ON_PlaneEquation *this,int i)

{
  switch(i) {
  case 0:
    break;
  case 1:
    return &this->y;
  case 2:
    return &this->z;
  case 3:
    return &this->d;
  default:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_point.cpp"
               ,0x1b49,"","Invalid coefficient index.");
    this = (ON_PlaneEquation *)onmalloc_forever(8);
    this->x = ON_DBL_QNAN;
  }
  return &this->x;
}

Assistant:

double& ON_PlaneEquation::operator[](int i)
{
  switch (i)
  {
  case 0:
    return x;
    break;
  case 1:
    return y;
    break;
  case 2:
    return z;
    break;
  case 3:
    return d;
    break;
  }

  ON_ERROR("Invalid coefficient index.");

  // send caller something that can be dereferenced without crashing.
  double* invalid_coefficient = (double*)onmalloc_forever(sizeof(*invalid_coefficient));
  *invalid_coefficient = ON_DBL_QNAN;
  return *invalid_coefficient;
}